

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
should_be_able_to_return_value_in_visitor::Visitor::doAssert(Visitor *this,Ref *header,Ref *logon)

{
  bool bVar1;
  char *pcVar2;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message;
  char *in_R9;
  AssertHelper local_f48;
  Message local_f40;
  undefined1 local_f38 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_f08;
  Message local_f00;
  bool local_ef1;
  undefined1 local_ef0 [8];
  AssertionResult gtest_ar__3;
  Message local_ed8;
  char local_ec9;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_e98;
  Message local_e90;
  bool local_e81;
  undefined1 local_e80 [8];
  AssertionResult gtest_ar__2;
  Message local_e68;
  undefined1 local_e60 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_e30;
  Message local_e28;
  bool local_e19;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_e00 [7];
  char msgDirection;
  string refMsgType;
  Message local_dd8;
  int local_dcc;
  unsigned_long local_dc8;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar_1;
  Values msgTypes;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  string local_140;
  AssertHelper local_120;
  Message local_118 [3];
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_;
  string senderCompId;
  Ref *logon_local;
  Ref *header_local;
  Visitor *this_local;
  
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_f9 = Fixpp::
             tryGet<Fixpp::TagT<49u,Fixpp::Type::String>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
                       (header,(UnderlyingType *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,(internal *)local_f8,
               (AssertionResult *)"Fixpp::tryGet<Fixpp::Tag::SenderCompID>(header, senderCompId)",
               "false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    testing::Message::~Message(local_118);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[4]>
              ((EqHelper<false> *)local_158,"senderCompId","\"ABC\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_,(char (*) [4])0x1680c53);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130),
                 kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x75,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130),
                 &local_160);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130))
      ;
      testing::Message::~Message(&local_160);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      Fixpp::
      get<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                ((Values *)&gtest_ar_1.message_,(Fixpp *)logon,message);
      local_dc8 = ((long)msgTypes.
                         super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                         .
                         super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                         .
                         super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                         .super_SmallVectorBase.BeginX - (long)gtest_ar_1.message_.ptr_) / 0x138;
      local_dcc = 2;
      testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                ((EqHelper<false> *)local_dc0,"msgTypes.size()","2",&local_dc8,&local_dcc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
      if (!bVar1) {
        testing::Message::Message(&local_dd8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dc0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)((long)&refMsgType.field_2 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x78,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)((long)&refMsgType.field_2 + 8),&local_dd8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)((long)&refMsgType.field_2 + 8));
        testing::Message::~Message(&local_dd8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        std::__cxx11::string::string((string *)local_e00);
        if (((long)msgTypes.
                   super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                   .
                   super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                   .
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                   .super_SmallVectorBase.BeginX - (long)gtest_ar_1.message_.ptr_) / 0x138 == 0) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                        ,0x182,
                        "reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) [T = Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                       );
        }
        local_e19 = Fixpp::
                    tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                              ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                *)gtest_ar_1.message_.ptr_,(UnderlyingType *)local_e00);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_e18,&local_e19,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
        if (!bVar1) {
          testing::Message::Message(&local_e28);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_e18,
                     (AssertionResult *)
                     "Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[0], refMsgType)","false","true"
                     ,in_R9);
          pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_2.message_);
          testing::internal::AssertHelper::AssertHelper
                    (&local_e30,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x7d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_e30,&local_e28);
          testing::internal::AssertHelper::~AssertHelper(&local_e30);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_e28);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
                    ((EqHelper<false> *)local_e60,"refMsgType","\"TEST\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e00,
                     (char (*) [5])"TEST");
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e60);
          if (!bVar1) {
            testing::Message::Message(&local_e68);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e60);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x7e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__2.message_,&local_e68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
            testing::Message::~Message(&local_e68);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e60);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            if (((long)msgTypes.
                       super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                       .super_SmallVectorBase.BeginX - (long)gtest_ar_1.message_.ptr_) / 0x138 == 0)
            {
              __assert_fail("idx < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                            ,0x182,
                            "reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) [T = Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                           );
            }
            local_e81 = Fixpp::
                        tryGet<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                                  ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                    *)gtest_ar_1.message_.ptr_,
                                   (UnderlyingType *)((long)&gtest_ar__1.message_.ptr_ + 7));
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_e80,&local_e81,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e80);
            if (!bVar1) {
              testing::Message::Message(&local_e90);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_3.message_,(internal *)local_e80,
                         (AssertionResult *)
                         "Fixpp::tryGet<Fixpp::Tag::MsgDirection>(msgTypes[0], msgDirection)",
                         "false","true",in_R9);
              pcVar2 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&gtest_ar_3.message_);
              testing::internal::AssertHelper::AssertHelper
                        (&local_e98,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x80,pcVar2);
              testing::internal::AssertHelper::operator=(&local_e98,&local_e90);
              testing::internal::AssertHelper::~AssertHelper(&local_e98);
              std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_e90);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_e80);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_ec9 = 'C';
              testing::internal::EqHelper<false>::Compare<char,char>
                        ((EqHelper<false> *)local_ec8,"msgDirection","\'C\'",
                         (char *)((long)&gtest_ar__1.message_.ptr_ + 7),&local_ec9);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec8);
              if (!bVar1) {
                testing::Message::Message(&local_ed8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ec8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                           ,0x81,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__3.message_,&local_ed8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__3.message_);
                testing::Message::~Message(&local_ed8);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec8);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                if ((ulong)(((long)msgTypes.
                                   super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                                   .
                                   super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                                   .
                                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                                   .super_SmallVectorBase.BeginX - (long)gtest_ar_1.message_.ptr_) /
                           0x138) < 2) {
                  __assert_fail("idx < size()",
                                "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                                ,0x182,
                                "reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) [T = Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                               );
                }
                local_ef1 = Fixpp::
                            tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                                      ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                        *)((long)&gtest_ar_1.message_.ptr_[9].field_2 + 8),
                                       (UnderlyingType *)local_e00);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_ef0,&local_ef1,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_ef0);
                if (!bVar1) {
                  testing::Message::Message(&local_f00);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_4.message_,(internal *)local_ef0,
                             (AssertionResult *)
                             "Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[1], refMsgType)",
                             "false","true",in_R9);
                  pcVar2 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&gtest_ar_4.message_);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_f08,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                             ,0x83,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_f08,&local_f00);
                  testing::internal::AssertHelper::~AssertHelper(&local_f08);
                  std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                  testing::Message::~Message(&local_f00);
                }
                gtest_ar.message_.ptr_._5_3_ = 0;
                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef0);
                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
                            ((EqHelper<false> *)local_f38,"refMsgType","\"TEST\"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e00,(char (*) [5])"TEST");
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_f38);
                  if (!bVar1) {
                    testing::Message::Message(&local_f40);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f38)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_f48,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                               ,0x84,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_f48,&local_f40);
                    testing::internal::AssertHelper::~AssertHelper(&local_f48);
                    testing::Message::~Message(&local_f40);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f38);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    gtest_ar.message_.ptr_._4_4_ = 0;
                  }
                }
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)local_e00);
      }
      llvm::
      SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_10U>
      ::~SmallVector((SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_10U>
                      *)&gtest_ar_1.message_);
    }
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

void doAssert(const Fixpp::v42::Header::Ref& header, const Fixpp::v42::Message::Logon::Ref& logon)
        {
            std::string senderCompId;
            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::SenderCompID>(header, senderCompId));
            ASSERT_EQ(senderCompId, "ABC");

            auto msgTypes = Fixpp::get<Fixpp::Tag::NoMsgTypes>(logon);
            ASSERT_EQ(msgTypes.size(), 2);

            std::string refMsgType;
            char msgDirection;

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[0], refMsgType));
            ASSERT_EQ(refMsgType, "TEST");

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::MsgDirection>(msgTypes[0], msgDirection));
            ASSERT_EQ(msgDirection, 'C');

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[1], refMsgType));
            ASSERT_EQ(refMsgType, "TEST");
        }